

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_do_operation__null(ma_device *pDevice,ma_uint32 operation)

{
  ma_bool32 mVar1;
  ma_uint32 operation_local;
  ma_device *pDevice_local;
  
  LOCK();
  (pDevice->field_23).null_device.operation = operation;
  UNLOCK();
  mVar1 = ma_event_signal(&(pDevice->field_23).null_device.operationEvent);
  if (mVar1 == 0) {
    pDevice_local._4_4_ = -1;
  }
  else {
    mVar1 = ma_event_wait(&(pDevice->field_23).null_device.operationCompletionEvent);
    if (mVar1 == 0) {
      pDevice_local._4_4_ = -1;
    }
    else {
      pDevice_local._4_4_ = (pDevice->field_23).null_device.operationResult;
    }
  }
  return pDevice_local._4_4_;
}

Assistant:

static ma_result ma_device_do_operation__null(ma_device* pDevice, ma_uint32 operation)
{
    ma_atomic_exchange_32(&pDevice->null_device.operation, operation);
    if (!ma_event_signal(&pDevice->null_device.operationEvent)) {
        return MA_ERROR;
    }

    if (!ma_event_wait(&pDevice->null_device.operationCompletionEvent)) {
        return MA_ERROR;
    }

    return pDevice->null_device.operationResult;
}